

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<kj::StringPtr_&> __thiscall
kj::Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>>::
find<0ul,char_const(&)[6]>
          (Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>> *this,
          char (*params) [6])

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  size_t sVar6;
  Maybe<kj::StringPtr_&> MVar7;
  ulong unaff_R12;
  Iterator iter;
  long local_78;
  long local_70;
  Iterator local_68;
  SearchKey local_50;
  Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>> *local_48;
  undefined1 *local_40;
  char (*local_38) [6];
  
  local_40 = (undefined1 *)&local_78;
  local_48 = this + 0x20;
  local_78 = *(long *)this;
  local_70 = *(long *)(this + 8) - local_78 >> 4;
  local_50._vptr_SearchKey = (_func_int **)&PTR_search_001c0a80;
  local_38 = params;
  _::BTreeImpl::search(&local_68,(BTreeImpl *)(this + 0x28),&local_50);
  lVar4 = local_78;
  if ((ulong)local_68.row != 0xe) {
    uVar1 = (local_68.leaf)->rows[local_68.row].i;
    unaff_R12 = (ulong)uVar1;
    if (uVar1 != 0) {
      unaff_R12 = (ulong)(uVar1 - 1);
      lVar2 = *(long *)(local_78 + 8 + unaff_R12 * 0x10);
      sVar6 = strlen(*params);
      if (lVar2 == sVar6 + 1) {
        iVar5 = bcmp(*(void **)(lVar4 + unaff_R12 * 0x10),params,lVar2 - 1);
        if (iVar5 == 0) {
          bVar3 = true;
          goto LAB_001505c9;
        }
      }
    }
  }
  bVar3 = false;
LAB_001505c9:
  MVar7.ptr = (StringPtr *)0x0;
  if (bVar3) {
    MVar7.ptr = (StringPtr *)(unaff_R12 * 0x10 + *(long *)this);
  }
  return (Maybe<kj::StringPtr_&>)MVar7.ptr;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_MAYBE(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[*pos];
  } else {
    return nullptr;
  }
}